

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QSqlFieldPrivate>::reset
          (QExplicitlySharedDataPointer<QSqlFieldPrivate> *this,QSqlFieldPrivate *ptr)

{
  bool bVar1;
  QSqlFieldPrivate *this_00;
  QSqlFieldPrivate *in_RSI;
  long in_FS_OFFSET;
  QSqlFieldPrivate *old;
  totally_ordered_wrapper<QSqlFieldPrivate_*> *in_stack_ffffffffffffffb8;
  QSqlFieldPrivate **in_stack_ffffffffffffffc0;
  totally_ordered_wrapper<QSqlFieldPrivate_*> local_20;
  totally_ordered_wrapper<QSqlFieldPrivate_*> local_18;
  QSqlFieldPrivate *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  bVar1 = Qt::operator!=<QSqlFieldPrivate_*,_true>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    if (local_10 != (QSqlFieldPrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1354bf);
    }
    Qt::totally_ordered_wrapper<QSqlFieldPrivate_*>::totally_ordered_wrapper(&local_20,local_10);
    local_18 = std::
               exchange<Qt::totally_ordered_wrapper<QSqlFieldPrivate*>,Qt::totally_ordered_wrapper<QSqlFieldPrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QSqlFieldPrivate_*> *)0x1354dd);
    this_00 = Qt::totally_ordered_wrapper<QSqlFieldPrivate_*>::get(&local_18);
    if (((this_00 != (QSqlFieldPrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x135503), !bVar1)) &&
       (this_00 != (QSqlFieldPrivate *)0x0)) {
      QSqlFieldPrivate::~QSqlFieldPrivate(this_00);
      operator_delete(this_00,0x78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }